

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::xml_node::print
          (xml_node *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding,
          uint depth)

{
  xml_buffered_writer buffered_writer;
  xml_buffered_writer local_2840;
  
  if (this->_root != (xml_node_struct *)0x0) {
    impl::anon_unknown_0::xml_buffered_writer::xml_buffered_writer(&local_2840,writer,encoding);
    impl::anon_unknown_0::node_output(&local_2840,this->_root,indent,flags,depth);
    impl::anon_unknown_0::xml_buffered_writer::flush(&local_2840);
  }
  return;
}

Assistant:

PUGI_IMPL_FN void xml_node::print(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding, unsigned int depth) const
	{
		if (!_root) return;

		impl::xml_buffered_writer buffered_writer(writer, encoding);

		impl::node_output(buffered_writer, _root, indent, flags, depth);

		buffered_writer.flush();
	}